

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O3

void __thiscall QWidgetResizeHandler::mouseMoveEvent(QWidgetResizeHandler *this,QMouseEvent *e)

{
  QRect *pQVar1;
  uint uVar2;
  long lVar3;
  QWidgetData *pQVar4;
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  QPoint QVar11;
  QSize QVar12;
  QSize QVar13;
  Representation RVar14;
  Representation RVar15;
  Representation RVar16;
  MousePosition m;
  Representation RVar17;
  QWidget *pQVar18;
  int iVar19;
  Representation RVar20;
  ulong uVar21;
  int iVar22;
  Representation RVar23;
  Representation RVar24;
  Representation RVar25;
  Representation RVar26;
  long in_FS_OFFSET;
  double dVar27;
  QRect QVar28;
  QStringView QVar29;
  QLatin1String QVar30;
  undefined1 auVar31 [16];
  QSize local_98;
  QRect local_78;
  undefined1 local_68 [12];
  Representation RStack_5c;
  long local_58;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar18 = *(QWidget **)(this + 0x10);
  auVar31 = QEventPoint::globalPosition();
  dVar27 = (double)((ulong)auVar31._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar31._0_8_;
  bVar6 = 2147483647.0 < dVar27;
  if (dVar27 <= -2147483648.0) {
    dVar27 = -2147483648.0;
  }
  local_68._0_4_ =
       (undefined4)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar27);
  dVar27 = (double)((ulong)auVar31._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar31._8_8_;
  bVar6 = 2147483647.0 < dVar27;
  if (dVar27 <= -2147483648.0) {
    dVar27 = -2147483648.0;
  }
  local_68._4_4_ =
       (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar27);
  local_40 = QWidget::mapFromGlobal(pQVar18,(QPoint *)local_68);
  if (((byte)this[0x40] & 3) == 0) {
    iVar19 = *(int *)(this + 0x3c);
    RVar15 = local_40.yp.m_i;
    RVar10 = local_40.xp.m_i;
    if (iVar19 < RVar10.m_i || iVar19 < RVar15.m_i) {
      lVar3 = *(long *)(*(long *)(this + 0x10) + 0x20);
      if (RVar15.m_i < (*(int *)(lVar3 + 0x20) - (iVar19 + *(int *)(lVar3 + 0x18))) + 1) {
        if (iVar19 < RVar15.m_i) {
          if (iVar19 < RVar10.m_i) {
            if (RVar10.m_i < (*(int *)(lVar3 + 0x1c) - (iVar19 + *(int *)(lVar3 + 0x14))) + 1) {
              register0x00000010 =
                   (storage_type_conflict *)
                   CONCAT44(*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18),
                            *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14));
              local_68._0_4_ = 0;
              local_68._4_4_ = 0;
              cVar7 = QRect::contains((QPoint *)local_68,SUB81(&local_40,0));
              if (cVar7 == '\0') {
                *(undefined4 *)(this + 0x30) = 0;
              }
              else {
                *(undefined4 *)(this + 0x30) = 9;
              }
            }
            else {
              *(undefined4 *)(this + 0x30) = 8;
            }
          }
          else {
            *(undefined4 *)(this + 0x30) = 7;
          }
        }
        else {
          iVar22 = (*(int *)(lVar3 + 0x1c) - (*(int *)(lVar3 + 0x14) + iVar19)) + 1;
LAB_0046d302:
          if (RVar10.m_i < iVar22) {
            *(undefined4 *)(this + 0x30) = 5;
          }
          else {
            *(undefined4 *)(this + 0x30) = 4;
          }
        }
      }
      else {
        iVar22 = (*(int *)(lVar3 + 0x1c) - (*(int *)(lVar3 + 0x14) + iVar19)) + 1;
        if (RVar10.m_i < iVar22) {
          if (iVar19 < RVar10.m_i) {
            if (RVar15.m_i <= iVar19) goto LAB_0046d302;
            *(undefined4 *)(this + 0x30) = 6;
          }
          else {
            *(undefined4 *)(this + 0x30) = 3;
          }
        }
        else {
          *(undefined4 *)(this + 0x30) = 2;
        }
      }
    }
    else {
      *(undefined4 *)(this + 0x30) = 1;
    }
    bVar6 = QWidget::isMinimized(*(QWidget **)(this + 0x10));
    if ((bVar6) || (((byte)this[0x40] & 4) == 0)) {
      *(undefined4 *)(this + 0x30) = 9;
      m = Center;
    }
    else {
      m = *(MousePosition *)(this + 0x30);
    }
    setMouseCursor(this,m);
    goto LAB_0046d518;
  }
  if ((*(int *)(this + 0x30) == 9) ||
     (bVar6 = QWidget::testAttribute_helper(*(QWidget **)(this + 0x10),WA_WState_ConfigPending),
     bVar6)) goto LAB_0046d518;
  local_48 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  if (((*(byte *)(*(long *)(*(long *)(this + 0x10) + 0x20) + 0xc) & 1) == 0) &&
     (pQVar18 = *(QWidget **)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10),
     pQVar18 != (QWidget *)0x0)) {
    auVar31 = QEventPoint::globalPosition();
    dVar27 = (double)((ulong)auVar31._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar31._0_8_;
    bVar6 = 2147483647.0 < dVar27;
    if (dVar27 <= -2147483648.0) {
      dVar27 = -2147483648.0;
    }
    local_68._0_4_ =
         (undefined4)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar27);
    dVar27 = (double)((ulong)auVar31._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar31._8_8_;
    bVar6 = 2147483647.0 < dVar27;
    if (dVar27 <= -2147483648.0) {
      dVar27 = -2147483648.0;
    }
    local_68._4_4_ =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar27);
    QVar11 = QWidget::mapFromGlobal(pQVar18,(QPoint *)local_68);
  }
  else {
    auVar31 = QEventPoint::globalPosition();
    dVar27 = (double)((ulong)auVar31._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar31._0_8_;
    bVar6 = 2147483647.0 < dVar27;
    if (dVar27 <= -2147483648.0) {
      dVar27 = -2147483648.0;
    }
    QVar11.xp.m_i =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar27);
    dVar27 = (double)((ulong)auVar31._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar31._8_8_;
    bVar6 = 2147483647.0 < dVar27;
    if (dVar27 <= -2147483648.0) {
      dVar27 = -2147483648.0;
    }
    QVar11.yp.m_i =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar27);
  }
  local_48 = QVar11;
  if ((*(byte *)(*(long *)(*(long *)(this + 0x10) + 0x20) + 0xc) & 1) == 0) {
    lVar3 = *(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10) + 0x20);
    register0x00000008 =
         (storage_type_conflict *)
         CONCAT44(*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18),
                  *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14));
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    cVar7 = QRect::contains((QPoint *)local_68,SUB81(&local_48,0));
    QVar11 = (QPoint)((ulong)local_48 & 0xffffffff);
    RVar10.m_i = local_48.yp.m_i;
    if (cVar7 == '\0') {
      if (local_48.xp.m_i < 0) {
        local_48 = (QPoint)((ulong)(uint)local_48.yp.m_i << 0x20);
        QVar11.xp.m_i = 0;
        QVar11.yp.m_i = 0;
      }
      RVar10.m_i = local_48.yp.m_i;
      if ((long)local_48 < 0) {
        local_48 = (QPoint)((ulong)local_48 & 0xffffffff);
        RVar10.m_i = 0;
      }
      lVar3 = *(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10) + 0x20);
      RVar15.m_i = (*(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14)) + 1;
      if (RVar15.m_i < QVar11.xp.m_i.m_i) {
        local_48.xp.m_i = RVar15.m_i;
        QVar11.yp.m_i = 0;
        QVar11.xp.m_i = RVar15.m_i;
      }
      RVar15.m_i = (*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1;
      if (RVar15.m_i < RVar10.m_i) {
        local_48.yp.m_i = RVar15.m_i;
        RVar10.m_i = RVar15.m_i;
      }
    }
  }
  else {
    RVar10.m_i = QVar11.yp.m_i.m_i;
  }
  RVar24.m_i = *(int *)(this + 0x28) + QVar11.xp.m_i.m_i;
  iVar22 = *(int *)(this + 0x2c) + RVar10.m_i;
  RVar17.m_i = QVar11.xp.m_i.m_i - *(int *)(this + 0x20);
  iVar19 = RVar10.m_i - *(int *)(this + 0x24);
  QGuiApplication::platformName();
  if (local_58 == 3) {
    QVar29.m_data = stack0xffffffffffffffa0;
    QVar29.m_size = 3;
    QVar30.m_data = "xcb";
    QVar30.m_size = 3;
    cVar7 = QtPrivate::equalStrings(QVar29,QVar30);
  }
  else {
    cVar7 = '\0';
  }
  if ((QPoint)local_68._0_8_ != (QPoint)0x0) {
    LOCK();
    *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_68._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  RVar8.m_i = iVar19;
  RVar23.m_i = iVar22;
  if (cVar7 != '\0') {
    QVar28 = QWidgetPrivate::availableScreenGeometry(*(QWidget **)(this + 0x10));
    if (RVar17.m_i <= QVar28.x1.m_i.m_i) {
      RVar17.m_i = QVar28.x1.m_i.m_i;
    }
    RVar8.m_i = QVar28.y1.m_i.m_i;
    if (QVar28.y1.m_i.m_i < iVar19) {
      RVar8.m_i = iVar19;
    }
    if (QVar28.x2.m_i.m_i <= RVar24.m_i) {
      RVar24.m_i = QVar28.x2.m_i.m_i;
    }
    RVar23.m_i = QVar28.y2.m_i.m_i;
    if (iVar22 < QVar28.y2.m_i.m_i) {
      RVar23.m_i = iVar22;
    }
  }
  local_98 = qSmartMinSize(*(QWidget **)(this + 0x18));
  RVar14 = local_98.ht.m_i;
  if (*(QWidget **)(this + 0x18) != *(QWidget **)(this + 0x10)) {
    local_98.wd.m_i = local_98.wd.m_i.m_i + *(int *)(this + 0x34) * 2;
    local_98.ht.m_i = 0;
    RVar14.m_i = RVar14.m_i + *(int *)(this + 0x38) + *(int *)(this + 0x34) * 2;
  }
  QVar12 = QWidget::maximumSize(*(QWidget **)(this + 0x18));
  RVar25 = QVar12.ht.m_i;
  pQVar18 = *(QWidget **)(this + 0x10);
  if (*(QWidget **)(this + 0x18) != pQVar18) {
    QVar12.wd.m_i = QVar12.wd.m_i.m_i + *(int *)(this + 0x34) * 2;
    QVar12.ht.m_i = 0;
    RVar25.m_i = RVar25.m_i + *(int *)(this + 0x38) + *(int *)(this + 0x34) * 2;
  }
  RVar16.m_i = ((pQVar18->data->crect).x2.m_i - RVar17.m_i) + 1;
  RVar26.m_i = ((pQVar18->data->crect).y2.m_i - RVar8.m_i) + 1;
  QVar13 = QWidget::minimumSize(pQVar18);
  if (RVar16.m_i <= QVar13.wd.m_i.m_i) {
    RVar16.m_i = QVar13.wd.m_i.m_i;
  }
  if (RVar26.m_i <= QVar13.ht.m_i.m_i) {
    RVar26.m_i = QVar13.ht.m_i.m_i;
  }
  RVar9 = local_98.wd.m_i;
  if (RVar16.m_i <= RVar9.m_i) {
    RVar16.m_i = RVar9.m_i;
  }
  if (RVar26.m_i <= RVar14.m_i) {
    RVar26.m_i = RVar14.m_i;
  }
  RVar20 = QVar12.wd.m_i;
  if (RVar20.m_i <= RVar16.m_i) {
    RVar16.m_i = RVar20.m_i;
  }
  if (RVar25.m_i <= RVar26.m_i) {
    RVar26.m_i = RVar25.m_i;
  }
  pQVar4 = (*(QWidget **)(this + 0x10))->data;
  uVar2 = (pQVar4->crect).x2.m_i;
  iVar19 = (pQVar4->crect).y2.m_i;
  local_68._0_4_ = (pQVar4->crect).x1;
  local_68._4_4_ = (pQVar4->crect).y1;
  local_68._8_4_ = (pQVar4->crect).x2;
  unique0x100004e7 = (pQVar4->crect).y2;
  if (7 < *(int *)(this + 0x30) - 1U) {
    uVar21 = (ulong)unique0x100004e3 & 0xffffffff;
    RVar23.m_i = unique0x100004e7;
    goto LAB_0046d42a;
  }
  pQVar1 = &pQVar4->crect;
  local_68._0_4_ = (uVar2 - RVar16.m_i) + 1;
  local_68._4_4_ = (iVar19 - RVar26.m_i) + 1;
  switch(*(int *)(this + 0x30)) {
  case 1:
    uVar21._0_4_ = (pQVar4->crect).x2;
    uVar21._4_4_ = (pQVar4->crect).y2;
    goto LAB_0046d3b8;
  case 2:
    local_68._0_4_ = pQVar1->x1;
    local_68._4_4_ = pQVar1->y1;
    iVar19 = RVar23.m_i;
    break;
  case 3:
    local_68._4_4_ = (pQVar4->crect).y1.m_i;
    goto LAB_0046d403;
  case 4:
    local_68._0_4_ = (pQVar1->x1).m_i;
    break;
  case 5:
    local_68._0_4_ = (pQVar4->crect).x1.m_i;
    uVar21._0_4_ = (pQVar4->crect).x2;
    uVar21._4_4_ = (pQVar4->crect).y2;
LAB_0046d3b8:
    RVar23.m_i = (int)(uVar21 >> 0x20);
LAB_0046d42a:
    RVar24.m_i = (int)uVar21;
    iVar19 = RVar23.m_i;
    break;
  case 6:
    local_68._0_4_ = pQVar1->x1;
    local_68._4_4_ = pQVar1->y1;
LAB_0046d403:
    uVar21 = (ulong)uVar2;
    goto LAB_0046d42a;
  case 7:
    uVar21._0_4_ = (pQVar4->crect).x2;
    uVar21._4_4_ = (pQVar4->crect).y2;
    local_68._4_4_ = (pQVar4->crect).y1.m_i;
    RVar23.m_i = uVar21._4_4_;
    goto LAB_0046d42a;
  case 8:
    local_68._0_4_ = pQVar1->x1;
    local_68._4_4_ = pQVar1->y1;
  }
  uVar5 = local_68._0_8_;
  RVar15.m_i = (int)local_68._0_8_;
  RVar26.m_i = (RVar24.m_i - RVar15.m_i) + 1;
  RVar10.m_i = SUB84(local_68._0_8_,4);
  RVar16.m_i = (iVar19 - RVar10.m_i) + 1;
  QVar12 = QWidget::minimumSize(*(QWidget **)(this + 0x10));
  if (RVar26.m_i <= QVar12.wd.m_i.m_i) {
    RVar26.m_i = QVar12.wd.m_i.m_i;
  }
  if (RVar16.m_i <= QVar12.ht.m_i.m_i) {
    RVar16.m_i = QVar12.ht.m_i.m_i;
  }
  if (RVar26.m_i <= RVar9.m_i) {
    RVar26.m_i = RVar9.m_i;
  }
  if (RVar16.m_i <= RVar14.m_i) {
    RVar16.m_i = RVar14.m_i;
  }
  if (RVar20.m_i <= RVar26.m_i) {
    RVar26.m_i = RVar20.m_i;
  }
  if (RVar25.m_i <= RVar16.m_i) {
    RVar16.m_i = RVar25.m_i;
  }
  iVar22 = RVar15.m_i + RVar26.m_i + -1;
  iVar19 = RVar10.m_i + -1 + RVar16.m_i;
  stack0xffffffffffffffa0 = (storage_type_conflict *)CONCAT44(iVar19,iVar22);
  pQVar18 = *(QWidget **)(this + 0x10);
  pQVar4 = pQVar18->data;
  local_68._0_8_ = uVar5;
  if (((((pQVar4->crect).x1.m_i != RVar15.m_i) || (iVar22 != (pQVar4->crect).x2.m_i)) ||
      ((pQVar4->crect).y1.m_i != RVar10.m_i)) || (iVar19 != (pQVar4->crect).y2.m_i)) {
    if (((pQVar4->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      lVar3 = *(long *)(*(long *)(*(long *)&pQVar18->field_0x8 + 0x10) + 0x20);
      local_78.x2.m_i = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
      local_78.y2.m_i = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
      local_78.x1.m_i = 0;
      local_78.y1.m_i = 0;
      cVar7 = QRect::intersects(&local_78);
      if (cVar7 == '\0') goto LAB_0046d518;
      pQVar18 = *(QWidget **)(this + 0x10);
    }
    QWidget::setGeometry(pQVar18,(QRect *)local_68);
  }
LAB_0046d518:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::mouseMoveEvent(QMouseEvent *e)
{
    QPoint pos = widget->mapFromGlobal(e->globalPosition().toPoint());
    if (!active && !buttonDown) {
        if (pos.y() <= range && pos.x() <= range)
            mode = TopLeft;
        else if (pos.y() >= widget->height()-range && pos.x() >= widget->width()-range)
            mode = BottomRight;
        else if (pos.y() >= widget->height()-range && pos.x() <= range)
            mode = BottomLeft;
        else if (pos.y() <= range && pos.x() >= widget->width()-range)
            mode = TopRight;
        else if (pos.y() <= range)
            mode = Top;
        else if (pos.y() >= widget->height()-range)
            mode = Bottom;
        else if (pos.x() <= range)
            mode = Left;
        else if ( pos.x() >= widget->width()-range)
            mode = Right;
        else if (widget->rect().contains(pos))
            mode = Center;
        else
            mode = Nowhere;

        if (widget->isMinimized() || !isEnabled())
            mode = Center;
#ifndef QT_NO_CURSOR
        setMouseCursor(mode);
#endif
        return;
    }

    if (mode == Center)
        return;

    if (widget->testAttribute(Qt::WA_WState_ConfigPending))
        return;


    QPoint globalPos = (!widget->isWindow() && widget->parentWidget()) ?
                       widget->parentWidget()->mapFromGlobal(e->globalPosition().toPoint()) : e->globalPosition().toPoint();
    if (!widget->isWindow() && !widget->parentWidget()->rect().contains(globalPos)) {
        if (globalPos.x() < 0)
            globalPos.rx() = 0;
        if (globalPos.y() < 0)
            globalPos.ry() = 0;
        if (globalPos.x() > widget->parentWidget()->width())
            globalPos.rx() = widget->parentWidget()->width();
        if (globalPos.y() > widget->parentWidget()->height())
            globalPos.ry() = widget->parentWidget()->height();
    }

    QPoint p = globalPos + invertedMoveOffset;
    QPoint pp = globalPos - moveOffset;

    // Workaround for window managers which refuse to move a tool window partially offscreen.
    if (QGuiApplication::platformName() == "xcb"_L1) {
        const QRect desktop = QWidgetPrivate::availableScreenGeometry(widget);
        pp.rx() = qMax(pp.x(), desktop.left());
        pp.ry() = qMax(pp.y(), desktop.top());
        p.rx() = qMin(p.x(), desktop.right());
        p.ry() = qMin(p.y(), desktop.bottom());
    }

    QSize ms = qSmartMinSize(childWidget);
    int mw = ms.width();
    int mh = ms.height();
    if (childWidget != widget) {
        mw += 2 * fw;
        mh += 2 * fw + extrahei;
    }

    QSize maxsize(childWidget->maximumSize());
    if (childWidget != widget)
        maxsize += QSize(2 * fw, 2 * fw + extrahei);
    QSize mpsize(widget->geometry().right() - pp.x() + 1,
                  widget->geometry().bottom() - pp.y() + 1);
    mpsize = mpsize.expandedTo(widget->minimumSize()).expandedTo(QSize(mw, mh))
                    .boundedTo(maxsize);
    QPoint mp(widget->geometry().right() - mpsize.width() + 1,
               widget->geometry().bottom() - mpsize.height() + 1);

    QRect geom = widget->geometry();

    switch (mode) {
    case TopLeft:
        geom = QRect(mp, widget->geometry().bottomRight()) ;
        break;
    case BottomRight:
        geom = QRect(widget->geometry().topLeft(), p) ;
        break;
    case BottomLeft:
        geom = QRect(QPoint(mp.x(), widget->geometry().y()), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case TopRight:
        geom = QRect(QPoint(widget->geometry().x(), mp.y()), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    case Top:
        geom = QRect(QPoint(widget->geometry().left(), mp.y()), widget->geometry().bottomRight()) ;
        break;
    case Bottom:
        geom = QRect(widget->geometry().topLeft(), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case Left:
        geom = QRect(QPoint(mp.x(), widget->geometry().top()), widget->geometry().bottomRight()) ;
        break;
    case Right:
        geom = QRect(widget->geometry().topLeft(), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    default:
        break;
    }

    geom = QRect(geom.topLeft(),
                  geom.size().expandedTo(widget->minimumSize())
                             .expandedTo(QSize(mw, mh))
                             .boundedTo(maxsize));

    if (geom != widget->geometry() &&
        (widget->isWindow() || widget->parentWidget()->rect().intersects(geom))) {
        widget->setGeometry(geom);
    }
}